

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::hilbert_init(tetgenmesh *this,int n)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int (*paaiVar7) [3] [8];
  ulong uVar8;
  ulong uVar9;
  int (*paaiVar10) [3] [8];
  uint auStack_58 [10];
  int gc [8];
  ulong uVar6;
  
  uVar5 = (uint)(n != 2) * 4 + 4;
  uVar6 = (ulong)uVar5;
  for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
    auStack_58[uVar2] = (uint)(uVar2 >> 1) & 0x7fffffff ^ (uint)uVar2;
  }
  paaiVar7 = this->transgc;
  uVar2 = 0;
  uVar9 = 0;
  if (0 < n) {
    uVar9 = (ulong)(uint)n;
  }
  for (; uVar2 != uVar6; uVar2 = uVar2 + 1) {
    paaiVar10 = paaiVar7;
    for (uVar3 = 0; uVar3 != uVar9; uVar3 = uVar3 + 1) {
      for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
        uVar4 = auStack_58[uVar8] * (2 << ((byte)uVar3 & 0x1f));
        (*paaiVar10)[0][uVar8] =
             ((int)uVar4 / (int)uVar5 | uVar4) & (uint)(n != 2) * 4 + 3 ^ (uint)uVar2;
      }
      paaiVar10 = (int (*) [3] [8])(*paaiVar10 + 1);
    }
    paaiVar7 = paaiVar7 + 1;
  }
  this->tsb1mod3[0] = 0;
  uVar2 = 1;
  while (uVar2 < uVar6) {
    iVar1 = 0;
    for (uVar5 = (uint)(uVar2 + 1) ^ (uint)uVar2; 1 < uVar5; uVar5 = (int)uVar5 >> 1) {
      iVar1 = iVar1 + 1;
    }
    this->tsb1mod3[uVar2] = iVar1 % n;
    uVar2 = uVar2 + 1;
  }
  return;
}

Assistant:

void tetgenmesh::hilbert_init(int n)
{
  int gc[8], N, mask, travel_bit;
  int e, d, f, k, g;
  int v, c;
  int i;

  N = (n == 2) ? 4 : 8;
  mask = (n == 2) ? 3 : 7;

  // Generate the Gray code sequence.
  for (i = 0; i < N; i++) {
    gc[i] = i ^ (i >> 1);
  }

  for (e = 0; e < N; e++) {
    for (d = 0; d < n; d++) {
      // Calculate the end point (f).
      f = e ^ (1 << d);  // Toggle the d-th bit of 'e'.
      // travel_bit = 2**p, the bit we want to travel. 
      travel_bit = e ^ f;
      for (i = 0; i < N; i++) {
        // // Rotate gc[i] left by (p + 1) % n bits.
        k = gc[i] * (travel_bit * 2);
        g = ((k | (k / N)) & mask);
        // Calculate the permuted Gray code by xor with the start point (e).
        transgc[e][d][i] = (g ^ e);
      }
    } // d
  } // e

  // Count the consecutive '1' bits (trailing) on the right.
  tsb1mod3[0] = 0;
  for (i = 1; i < N; i++) {
    v = ~i; // Count the 0s.
    v = (v ^ (v - 1)) >> 1; // Set v's trailing 0s to 1s and zero rest
    for (c = 0; v; c++) {
      v >>= 1;
    }
    tsb1mod3[i] = c % n;
  }
}